

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineIterator.cpp
# Opt level: O0

bool skipIfAtLineEnd(char **P)

{
  char **P_local;
  
  if (**P == '\n') {
    *P = *P + 1;
    P_local._7_1_ = true;
  }
  else if ((**P == '\r') && ((*P)[1] == '\n')) {
    *P = *P + 2;
    P_local._7_1_ = true;
  }
  else {
    P_local._7_1_ = false;
  }
  return P_local._7_1_;
}

Assistant:

static bool skipIfAtLineEnd(const char *&P) {
  if (*P == '\n') {
    ++P;
    return true;
  }
  if (*P == '\r' && *(P + 1) == '\n') {
    P += 2;
    return true;
  }
  return false;
}